

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * __thiscall cmsys::RegExpCompile::reg(RegExpCompile *this,int paren,int *flagp)

{
  char *pcVar1;
  char local_54;
  uint local_48;
  int local_44;
  int flags;
  int parno;
  char *ender;
  char *br;
  char *ret;
  int *flagp_local;
  RegExpCompile *pRStack_18;
  int paren_local;
  RegExpCompile *this_local;
  
  local_44 = 0;
  *flagp = 1;
  ret = (char *)flagp;
  flagp_local._4_4_ = paren;
  pRStack_18 = this;
  if (paren == 0) {
    br = (char *)0x0;
  }
  else {
    if (9 < this->regnpar) {
      printf("RegularExpression::compile(): Too many parentheses.\n");
      return (char *)0x0;
    }
    local_44 = this->regnpar;
    this->regnpar = this->regnpar + 1;
    br = regnode(this,(char)local_44 + '\x14');
  }
  ender = regbranch(this,(int *)&local_48);
  if (ender == (char *)0x0) {
    this_local = (RegExpCompile *)0x0;
  }
  else {
    pcVar1 = ender;
    if (br != (char *)0x0) {
      regtail(br,ender);
      pcVar1 = br;
    }
    br = pcVar1;
    if ((local_48 & 1) == 0) {
      *(uint *)ret = *(uint *)ret & 0xfffffffe;
    }
    *(uint *)ret = local_48 & 4 | *(uint *)ret;
    while (*this->regparse == '|') {
      this->regparse = this->regparse + 1;
      ender = regbranch(this,(int *)&local_48);
      if (ender == (char *)0x0) {
        return (char *)0x0;
      }
      regtail(br,ender);
      if ((local_48 & 1) == 0) {
        *(uint *)ret = *(uint *)ret & 0xfffffffe;
      }
      *(uint *)ret = local_48 & 4 | *(uint *)ret;
    }
    if (flagp_local._4_4_ == 0) {
      local_54 = '\0';
    }
    else {
      local_54 = (char)local_44 + '\x1e';
    }
    _flags = regnode(this,local_54);
    regtail(br,_flags);
    for (ender = br; ender != (char *)0x0; ender = regnext(ender)) {
      regoptail(ender,_flags);
    }
    if ((flagp_local._4_4_ == 0) ||
       (pcVar1 = this->regparse, this->regparse = pcVar1 + 1, *pcVar1 == ')')) {
      if ((flagp_local._4_4_ == 0) && (*this->regparse != '\0')) {
        if (*this->regparse == ')') {
          printf("RegularExpression::compile(): Unmatched parentheses.\n");
          this_local = (RegExpCompile *)0x0;
        }
        else {
          printf("RegularExpression::compile(): Internal error.\n");
          this_local = (RegExpCompile *)0x0;
        }
      }
      else {
        this_local = (RegExpCompile *)br;
      }
    }
    else {
      printf("RegularExpression::compile(): Unmatched parentheses.\n");
      this_local = (RegExpCompile *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

char* RegExpCompile::reg(int paren, int* flagp)
{
  char* ret;
  char* br;
  char* ender;
  int parno = 0;
  int flags;

  *flagp = HASWIDTH; // Tentatively.

  // Make an OPEN node, if parenthesized.
  if (paren) {
    if (regnpar >= RegularExpressionMatch::NSUBEXP) {
      // RAISE Error, SYM(RegularExpression), SYM(Too_Many_Parens),
      printf("RegularExpression::compile(): Too many parentheses.\n");
      return KWSYS_NULLPTR;
    }
    parno = regnpar;
    regnpar++;
    ret = regnode(static_cast<char>(OPEN + parno));
  } else
    ret = KWSYS_NULLPTR;

  // Pick up the branches, linking them together.
  br = regbranch(&flags);
  if (br == KWSYS_NULLPTR)
    return (KWSYS_NULLPTR);
  if (ret != KWSYS_NULLPTR)
    regtail(ret, br); // OPEN -> first.
  else
    ret = br;
  if (!(flags & HASWIDTH))
    *flagp &= ~HASWIDTH;
  *flagp |= flags & SPSTART;
  while (*regparse == '|') {
    regparse++;
    br = regbranch(&flags);
    if (br == KWSYS_NULLPTR)
      return (KWSYS_NULLPTR);
    regtail(ret, br); // BRANCH -> BRANCH.
    if (!(flags & HASWIDTH))
      *flagp &= ~HASWIDTH;
    *flagp |= flags & SPSTART;
  }

  // Make a closing node, and hook it on the end.
  ender = regnode(static_cast<char>((paren) ? CLOSE + parno : END));
  regtail(ret, ender);

  // Hook the tails of the branches to the closing node.
  for (br = ret; br != KWSYS_NULLPTR; br = regnext(br))
    regoptail(br, ender);

  // Check for proper termination.
  if (paren && *regparse++ != ')') {
    // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
    printf("RegularExpression::compile(): Unmatched parentheses.\n");
    return KWSYS_NULLPTR;
  } else if (!paren && *regparse != '\0') {
    if (*regparse == ')') {
      // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
      printf("RegularExpression::compile(): Unmatched parentheses.\n");
      return KWSYS_NULLPTR;
    } else {
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n");
      return KWSYS_NULLPTR;
    }
    // NOTREACHED
  }
  return (ret);
}